

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::RoaringAnalyzeState::RoaringAnalyzeState
          (RoaringAnalyzeState *this,CompressionInfo *info)

{
  _Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false> _Var1;
  uint uVar2;
  uint16_t val;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (uint)info;
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__AnalyzeState_024aa198;
  (this->super_AnalyzeState).info.block_manager = info->block_manager;
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__RoaringAnalyzeState_024aa300;
  (this->bitmask_table).
  super_unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  .super__Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false>._M_head_impl =
       (BitmaskTableEntry *)0x0;
  _Var1._M_head_impl = (BitmaskTableEntry *)operator_new__(0x200);
  (this->bitmask_table).
  super_unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  .super__Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  lVar3 = 0;
  do {
    *(byte *)(_Var1._M_head_impl + lVar3) = *(byte *)(_Var1._M_head_impl + lVar3) & 3;
    *(uint8_t *)((long)(_Var1._M_head_impl + lVar3) + 1) = '\0';
    uVar2 = 0;
    uVar5 = uVar4;
    do {
      uVar6 = 1 << ((byte)uVar2 & 0x1f) & (uint)lVar3;
      uVar4 = (uint)(uVar6 != 0);
      if ((byte)uVar2 == 7) {
        *(byte *)(_Var1._M_head_impl + lVar3) =
             *(byte *)(_Var1._M_head_impl + lVar3) & 0xfd | (uVar6 != 0) * '\x02';
LAB_017113a7:
        *(char *)(_Var1._M_head_impl + lVar3) =
             *(char *)(_Var1._M_head_impl + lVar3) + (uVar6 != 0) * '\x04';
        if ((~(byte)uVar5 & 1) == 0 && uVar6 == 0) {
          *(uint8_t *)((long)(_Var1._M_head_impl + lVar3) + 1U) =
               *(uint8_t *)((long)(_Var1._M_head_impl + lVar3) + 1U) + '\x01';
        }
      }
      else {
        if ((uVar2 & 0xff) != 0) goto LAB_017113a7;
        *(byte *)(_Var1._M_head_impl + lVar3) =
             ((uVar6 != 0) * '\x04' | uVar6 != 0) + (*(byte *)(_Var1._M_head_impl + lVar3) & 0xfe);
      }
      uVar2 = uVar2 + 1;
      uVar5 = uVar4;
    } while (uVar2 != 8);
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x100) {
      this->one_count = 0;
      this->zero_count = 0;
      this->run_count = 0;
      this->count = 0;
      this->data_size = 0;
      this->metadata_size = 0;
      this->segment_count = 0;
      this->current_count = 0;
      this->total_count = 0;
      this->total_size = 0;
      ContainerMetadataCollection::ContainerMetadataCollection(&this->metadata_collection);
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return;
    }
  } while( true );
}

Assistant:

RoaringAnalyzeState::RoaringAnalyzeState(const CompressionInfo &info)
    : AnalyzeState(info), bitmask_table(CreateBitmaskTable()) {
}